

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  bool bVar1;
  int iVar2;
  UnitTestImpl *this_00;
  UnitTest *this_01;
  TestEventListeners *this_02;
  TestEventListener *pTVar3;
  OsStackTraceGetterInterface *pOVar4;
  TimeInMillis TVar5;
  TestInfo *pTVar6;
  TestResult *this_03;
  int local_40;
  int local_3c;
  int j;
  int i;
  Timer timer;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestSuite *this_local;
  
  if ((this->should_run_ & 1U) == 0) {
    return;
  }
  this_00 = internal::GetUnitTestImpl();
  internal::UnitTestImpl::set_current_test_suite(this_00,this);
  this_01 = UnitTest::GetInstance();
  this_02 = UnitTest::listeners(this_01);
  pTVar3 = TestEventListeners::repeater(this_02);
  (*pTVar3->_vptr_TestEventListener[6])(pTVar3,this);
  (*pTVar3->_vptr_TestEventListener[7])(pTVar3,this);
  pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
  (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
  timer.start_.__d.__r = (time_point)RunSetUpTestSuite;
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x1400a0,(char *)0x0);
  TVar5 = internal::GetTimeInMillis();
  this->start_timestamp_ = TVar5;
  internal::Timer::Timer((Timer *)&j);
  for (local_3c = 0; iVar2 = total_test_count(this), local_3c < iVar2; local_3c = local_3c + 1) {
    pTVar6 = GetMutableTestInfo(this,local_3c);
    TestInfo::Run(pTVar6);
    if ((FLAGS_gtest_fail_fast & 1) != 0) {
      pTVar6 = GetMutableTestInfo(this,local_3c);
      this_03 = TestInfo::result(pTVar6);
      bVar1 = TestResult::Failed(this_03);
      local_40 = local_3c;
      if (bVar1) goto LAB_0011d3f4;
    }
  }
LAB_0011d43d:
  TVar5 = internal::Timer::Elapsed((Timer *)&j);
  this->elapsed_time_ = TVar5;
  pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
  (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x1400f0,(char *)0x0);
  (*pTVar3->_vptr_TestEventListener[0xb])(pTVar3,this);
  (*pTVar3->_vptr_TestEventListener[0xc])(pTVar3,this);
  internal::UnitTestImpl::set_current_test_suite(this_00,(TestSuite *)0x0);
  return;
LAB_0011d3f4:
  while( true ) {
    local_40 = local_40 + 1;
    iVar2 = total_test_count(this);
    if (iVar2 <= local_40) break;
    pTVar6 = GetMutableTestInfo(this,local_40);
    TestInfo::Skip(pTVar6);
  }
  goto LAB_0011d43d;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
    if (GTEST_FLAG(fail_fast) && GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}